

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O2

void backtracer_anything(t_backtracer *x,t_symbol *s,int argc,t_atom *argv)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint uVar4;
  t_msgstack *fatso;
  ulong uVar5;
  ulong uVar6;
  _outconnect *p_Var7;
  
  fatso = (t_msgstack *)getbytes(0x70);
  uVar4 = 5;
  if (argc < 5) {
    uVar4 = argc;
  }
  fatso->m_next = backtracer_stack;
  backtracer_stack = fatso;
  fatso->m_sel = s;
  fatso->m_argc = argc;
  uVar6 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 * 0x10 != uVar6; uVar6 = uVar6 + 0x10) {
    puVar1 = (undefined8 *)((long)&argv->a_type + uVar6);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)&fatso->m_argv[0].a_type + uVar6);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
  }
  fatso->m_owner = x;
  if (backtracer_tracing != 0) {
    backtracer_printmsg(x->b_owner,s,argc,argv);
  }
  p_Var7 = (_outconnect *)&x->b_connections;
  while (p_Var7 = p_Var7->oc_next, p_Var7 != (_outconnect *)0x0) {
    pd_typedmess(p_Var7->oc_to,s,argc,argv);
  }
  backtracer_stack = fatso->m_next;
  freebytes(fatso,0x70);
  return;
}

Assistant:

static void backtracer_anything(t_backtracer *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_msgstack *m = (t_msgstack *)t_getbytes(sizeof(t_msgstack));
    t_outconnect *oc;
    int ncopy = (argc > NARGS ? NARGS : argc), i;
    m->m_next = backtracer_stack;
    backtracer_stack = m;
    m->m_sel = s;
    m->m_argc = argc;
    for (i = 0; i < ncopy; i++)
        m->m_argv[i] = argv[i];
    m->m_owner = x;
    if (backtracer_tracing)
        backtracer_printmsg(x->b_owner, s, argc, argv);
    for (oc = x->b_connections; oc; oc = oc->oc_next)
        typedmess(oc->oc_to, s, argc, argv);
    backtracer_stack = m->m_next;
    t_freebytes(m, sizeof(*m));
}